

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setTransform(SlicePlane *this,mat4 newTransform)

{
  PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>> *)&this->objectTransform,
             &newTransform);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setTransform(glm::mat4 newTransform) {
  objectTransform = newTransform;
  polyscope::requestRedraw();
}